

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar1;
  char *p;
  AlphaNum *in_R8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string_view local_48 [3];
  
  if (*(long *)(**(long **)this + 0x18) == 0) {
    local_48[0] = NullSafeStringView("Import \"");
    pVVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)(*(long *)(this + 8) + 0x18),**(int **)(this + 0x10)
                       );
    local_78.piece_._M_str = (pVVar1->_M_dataplus)._M_p;
    local_78.piece_._M_len = pVVar1->_M_string_length;
    p = "\" has not been loaded.";
  }
  else {
    local_48[0] = NullSafeStringView("Import \"");
    pVVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)(*(long *)(this + 8) + 0x18),**(int **)(this + 0x10)
                       );
    local_78.piece_._M_str = (pVVar1->_M_dataplus)._M_p;
    local_78.piece_._M_len = pVVar1->_M_string_length;
    p = "\" was not found or had errors.";
  }
  local_a8.piece_ = NullSafeStringView(p);
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,&local_a8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}